

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  Vector3f *v;
  Point3<float> *p1;
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  CurveCommon *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  ShapeIntersection *pSVar9;
  pbrt *this_00;
  Bounds3<float> *b;
  float *pfVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar14 [64];
  float fVar16;
  type tVar17;
  undefined8 uVar29;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar31 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar32 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  undefined1 in_XMM10 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  Normal3<float> NVar36;
  Point3<float> PVar37;
  Vector3<float> VVar38;
  Point3f PVar39;
  span<const_pbrt::Point3<float>_> cp_01;
  span<const_pbrt::Point3<float>_> cp_02;
  float local_348;
  Tuple3<pbrt::Vector3,_float> local_328;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  Transform *local_2f0;
  float local_2e4;
  Tuple3<pbrt::Vector3,_float> local_2e0;
  Curve *local_2d0;
  Bounds3f rayBounds;
  Float u [3];
  Bounds3<float> local_2a0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  Tuple3<pbrt::Vector3,_float> *local_260;
  Point2f local_258;
  Tuple3<pbrt::Normal3,_float> local_250;
  Tuple3<pbrt::Normal3,_float> local_240;
  Vector3f pError;
  array<pbrt::Point3<float>,_7> cpSplit;
  Bounds3f curveBounds;
  undefined1 auVar15 [64];
  undefined8 uVar30;
  
  auVar33._4_60_ = in_register_00001284;
  auVar33._0_4_ = u1;
  auVar32._4_60_ = in_register_00001244;
  auVar32._0_4_ = u0;
  cp_01.n = (Point3<float> *)cp.n;
  this_00 = (pbrt *)cp.ptr;
  local_308 = auVar32._0_16_;
  local_2f0 = ObjectFromRay;
  if (depth < 1) {
    fVar35 = *(float *)(this_00 + 4);
    fVar16 = *(float *)this_00;
    auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar16 * (fVar16 - *(float *)(this_00 + 0xc)))),
                               ZEXT416((uint)fVar35),
                               ZEXT416((uint)(*(float *)(this_00 + 0x10) - fVar35)));
    if (0.0 <= auVar13._0_4_) {
      fVar1 = *(float *)(this_00 + 0x24);
      fVar2 = *(float *)(this_00 + 0x28);
      auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * (fVar1 - *(float *)(this_00 + 0x18)))),
                                 ZEXT416((uint)fVar2),
                                 ZEXT416((uint)(*(float *)(this_00 + 0x1c) - fVar2)));
      if (0.0 <= auVar13._0_4_) {
        fVar1 = fVar1 - fVar16;
        fVar2 = fVar2 - fVar35;
        fVar34 = fVar2 * fVar2 + fVar1 * fVar1;
        if ((fVar34 != 0.0) || (NAN(fVar34))) {
          fVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
          v = &ray->d;
          auVar13 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar13,auVar13);
          pCVar5 = this->common;
          auVar12 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
          auVar13 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
          auVar12._8_4_ = 0x80000000;
          auVar12._0_8_ = 0x8000000080000000;
          auVar12._12_4_ = 0x80000000;
          auVar15._16_48_ = in_ZmmResult._16_48_;
          auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar35),auVar12);
          auVar13 = vsqrtss_avx(auVar13,auVar13);
          auVar19 = ZEXT416((uint)(fVar2 * auVar12._0_4_));
          auVar18 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar16),auVar19);
          auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar2),auVar12,auVar19);
          fVar34 = (auVar18._0_4_ + auVar12._0_4_) / fVar34;
          fVar35 = auVar13._0_4_;
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * u1)),local_308,
                                    ZEXT416((uint)(1.0 - fVar34)));
          auVar13 = vminss_avx(auVar33._0_16_,auVar12);
          uVar30 = vcmpss_avx512f(auVar12,local_308,1);
          bVar8 = (bool)((byte)uVar30 & 1);
          auVar15._0_16_ = auVar13;
          auVar14._4_60_ = auVar15._4_60_;
          auVar14._0_4_ = (float)((uint)bVar8 * (int)u0 + (uint)!bVar8 * auVar13._0_4_);
          local_308 = auVar14._0_16_;
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * pCVar5->width[1])),
                                    ZEXT416((uint)(1.0 - auVar14._0_4_)),
                                    ZEXT416((uint)pCVar5->width[0]));
          local_348 = auVar13._0_4_;
          local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
          local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
          local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          if (pCVar5->type == Ribbon) {
            local_318._0_4_ = fVar34;
            fVar16 = sinf((1.0 - auVar14._0_4_) * pCVar5->normalAngle);
            local_288 = CONCAT44(local_288._4_4_,fVar16 * this->common->invSinNormalAngle);
            fVar16 = sinf((float)local_308._0_4_ * this->common->normalAngle);
            local_278._0_4_ = fVar16 * this->common->invSinNormalAngle;
            uVar30 = 0;
            NVar36 = Tuple3<pbrt::Normal3,float>::operator*
                               ((Tuple3<pbrt::Normal3,float> *)this->common->n,(float)local_288);
            local_2e4 = NVar36.super_Tuple3<pbrt::Normal3,_float>.z;
            local_288 = NVar36.super_Tuple3<pbrt::Normal3,_float>._0_8_;
            uVar29 = 0;
            uStack_280 = uVar30;
            NVar36 = Tuple3<pbrt::Normal3,float>::operator*
                               ((Tuple3<pbrt::Normal3,float> *)(this->common->n + 1),
                                (float)local_278._0_4_);
            auVar13._0_4_ = NVar36.super_Tuple3<pbrt::Normal3,_float>.x + (float)local_288;
            auVar13._4_4_ = NVar36.super_Tuple3<pbrt::Normal3,_float>.y + local_288._4_4_;
            auVar13._8_4_ = (float)uVar29 + (float)uStack_280;
            auVar13._12_4_ = (float)((ulong)uVar29 >> 0x20) + uStack_280._4_4_;
            local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 NVar36.super_Tuple3<pbrt::Normal3,_float>.z + local_2e4;
            local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
            tVar17 = AbsDot<float>((Normal3<float> *)&local_2a0,v);
            local_348 = local_348 * (tVar17 / fVar35);
            fVar34 = (float)local_318._0_4_;
          }
          auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar34));
          u[0] = 0.0;
          u[1] = 0.0;
          u[2] = 0.0;
          uVar30 = vcmpss_avx512f(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40,1);
          auVar31 = ZEXT856(auVar13._8_8_);
          PVar37 = EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                             (cp,(Float)((uint)!(bool)((byte)uVar30 & 1) * auVar13._0_4_),
                              (Vector3<float> *)u);
          fVar16 = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
          auVar22._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar22._8_56_ = auVar31;
          auVar18 = auVar22._0_16_;
          auVar13 = vmovshdup_avx(auVar18);
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar18,auVar18);
          if (auVar12._0_4_ <= local_348 * local_348 * 0.25) {
            if (fVar16 < 0.0) {
              return false;
            }
            if (fVar16 <= fVar35 * tMax) {
              if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
                if (si->set == true) {
                  local_318 = auVar18;
                  local_278 = auVar13;
                  pSVar9 = pstd::optional<pbrt::ShapeIntersection>::value(si);
                  auVar22 = ZEXT1664(local_318);
                  auVar13 = local_278;
                  if (pSVar9->tHit < fVar16 / fVar35) {
                    return false;
                  }
                }
                local_328.x = 0.0;
                local_328.y = 0.0;
                local_328.z = 0.0;
                auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ * u[1])),auVar13,
                                           ZEXT416((uint)u[0]));
                cp_00.ptr = this->common->cpObj;
                local_318._0_4_ = auVar13._0_4_;
                cp_00.n = 4;
                EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                          (cp_00,(Float)local_308._0_4_,(Vector3<float> *)&local_328);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                fVar1 = cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_328.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_328.y;
                uVar30 = curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_328.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_328.z;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_328.z;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar30;
                if (curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x == 0.0) {
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_328.y;
                  if ((((curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y == 0.0) &&
                       (!NAN(curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y))) &&
                      (local_328.z == 0.0)) && (!NAN(local_328.z))) {
                    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar1;
                    LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
                               ,0x2aa,"Check failed: %s != %s with %s = %s, %s = %s",
                               (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                               (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&cpSplit,
                               (char (*) [5])"dpdu",(Vector3<float> *)&curveBounds);
                  }
                }
                auVar13 = vsqrtss_avx(in_XMM10,ZEXT416((uint)auVar12._0_4_));
                uVar30 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_318._0_4_),1);
                bVar8 = (bool)((byte)uVar30 & 1);
                auVar19._0_4_ = auVar13._0_4_ / local_348;
                auVar19._4_12_ = auVar13._4_12_;
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar13 = vxorps_avx512vl(auVar19,auVar18);
                fVar2 = (float)((uint)bVar8 * (int)auVar19._0_4_ + (uint)!bVar8 * auVar13._0_4_) +
                        0.5;
                auVar31 = (undefined1  [56])0x0;
                local_260 = &v->super_Tuple3<pbrt::Vector3,_float>;
                if (this->common->type == Ribbon) {
                  VVar38 = Cross<float>((Normal3<float> *)&local_2a0,(Vector3<float> *)&local_328);
                  uVar30 = auVar31._0_8_;
                  auVar23._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar23._8_56_ = auVar31;
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ =
                       vmovlps_avx(auVar23._0_16_);
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                       VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  VVar38 = Normalize<float>((Vector3<float> *)&cpSplit);
                  local_2e0.z = local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar20._0_4_ = local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar20._4_4_ = local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar20._8_4_ = local_348 * (float)uVar30;
                  auVar20._12_4_ = local_348 * (float)((ulong)uVar30 >> 0x20);
                  local_2e0._0_8_ = vmovlps_avx(auVar20);
                }
                else {
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar1;
                  VVar38 = Transform::ApplyInverse<float>(local_2f0,(Vector3<float> *)&local_328);
                  uVar30 = auVar31._0_8_;
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar24._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar24._8_56_ = auVar31;
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ =
                       vmovlps_avx(auVar24._0_16_);
                  auVar13 = vmovshdup_avx(auVar24._0_16_);
                  auVar6._8_4_ = 0x80000000;
                  auVar6._0_8_ = 0x8000000080000000;
                  auVar6._12_4_ = 0x80000000;
                  auVar13 = vxorps_avx512vl(auVar13,auVar6);
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y =
                       VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = auVar13._0_4_;
                  cpSplit.values._8_8_ =
                       (ulong)(uint)cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x << 0x20;
                  VVar38 = Normalize<float>((Vector3<float> *)&cpSplit);
                  rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar21._0_4_ = local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar21._4_4_ = local_348 * VVar38.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar21._8_4_ = local_348 * (float)uVar30;
                  auVar21._12_4_ = local_348 * (float)((ulong)uVar30 >> 0x20);
                  auVar31 = ZEXT856(auVar21._8_8_);
                  rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar21);
                  if (this->common->type == Cylinder) {
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * 90.0)),
                                              ZEXT416((uint)(1.0 - fVar2)),ZEXT416(0xc2b40000));
                    auVar7._8_4_ = 0x80000000;
                    auVar7._0_8_ = 0x8000000080000000;
                    auVar7._12_4_ = 0x80000000;
                    auVar13 = vxorps_avx512vl(auVar13,auVar7);
                    auVar31 = ZEXT856(auVar13._8_8_);
                    Rotate((Transform *)&cpSplit,auVar13._0_4_,(Vector3f *)&curveBounds);
                    VVar38 = Transform::operator()
                                       ((Transform *)&cpSplit,(Vector3<float> *)&rayBounds);
                    rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                         VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar25._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar25._8_56_ = auVar31;
                    rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ =
                         vmovlps_avx(auVar25._0_16_);
                  }
                  VVar38 = Transform::operator()(local_2f0,(Vector3<float> *)&rayBounds);
                  local_2e0.z = VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar26._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar26._8_56_ = auVar31;
                  local_2e0._0_8_ = vmovlps_avx(auVar26._0_16_);
                }
                pError.super_Tuple3<pbrt::Vector3,_float>.x = local_348 + local_348;
                auVar31 = (undefined1  [56])0x0;
                bVar8 = this->common->reverseOrientation;
                bVar4 = this->common->transformSwapsHandedness;
                pError.super_Tuple3<pbrt::Vector3,_float>.y =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                pError.super_Tuple3<pbrt::Vector3,_float>.z =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                PVar39 = Ray::operator()(ray,fVar16 / fVar35);
                auVar27._0_8_ = PVar39.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar27._8_56_ = auVar31;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ =
                     vmovlps_avx(auVar27._0_16_);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                     PVar39.super_Tuple3<pbrt::Point3,_float>.z;
                Point3fi::Point3fi((Point3fi *)&rayBounds,cpSplit.values,&pError);
                local_258.super_Tuple2<pbrt::Point2,_float>.x = (float)local_308._0_4_;
                auVar31 = (undefined1  [56])0x0;
                local_258.super_Tuple2<pbrt::Point2,_float>.y = fVar2;
                VVar38 = Tuple3<pbrt::Vector3,_float>::operator-(local_260);
                auVar28._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar28._8_56_ = auVar31;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ =
                     vmovlps_avx(auVar28._0_16_);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                     VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                local_240.z = 0.0;
                local_240.x = 0.0;
                local_240.y = 0.0;
                local_250.z = 0.0;
                local_250.x = 0.0;
                local_250.y = 0.0;
                SurfaceInteraction::SurfaceInteraction
                          ((SurfaceInteraction *)&curveBounds,(Point3fi *)&rayBounds,&local_258,
                           (Vector3f *)&cpSplit,(Vector3f *)&local_328,(Vector3f *)&local_2e0,
                           (Normal3f *)&local_240,(Normal3f *)&local_250,ray->time,bVar8 != bVar4);
                Transform::operator()
                          ((SurfaceInteraction *)&cpSplit,this->common->renderFromObject,
                           (SurfaceInteraction *)&curveBounds);
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.y;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.z;
                pstd::optional<pbrt::ShapeIntersection>::operator=(si,(ShapeIntersection *)&cpSplit)
                ;
              }
              *(long *)(in_FS_OFFSET + -0x480) = *(long *)(in_FS_OFFSET + -0x480) + 1;
              return true;
            }
            return false;
          }
        }
      }
    }
  }
  else {
    cp_01.ptr = cp_01.n;
    SubdivideCubicBezier<pbrt::Point3<float>>(&cpSplit,this_00,cp_01);
    pfVar10 = u;
    local_318._0_4_ = depth + -1;
    u[1] = ((float)local_308._0_4_ + u1) * 0.5;
    u[0] = (Float)local_308._0_4_;
    u[2] = u1;
    local_2d0 = this;
    for (lVar11 = 0; pfVar10 = pfVar10 + 1, lVar11 != 0x48; lVar11 = lVar11 + 0x24) {
      fVar35 = *pfVar10;
      p1 = (Point3<float> *)((long)&cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar11);
      fVar16 = local_2d0->common->width[1];
      auVar12 = ZEXT416((uint)local_2d0->common->width[0]);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)((float)local_308._0_4_ * fVar16)),auVar12,
                                ZEXT416((uint)(1.0 - (float)local_308._0_4_)));
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar35)),auVar12,
                                ZEXT416((uint)(1.0 - fVar35)));
      auVar13 = vmaxss_avx(auVar12,auVar13);
      Bounds3<float>::Bounds3
                (&rayBounds,p1,
                 (Point3<float> *)
                 ((long)&cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x + lVar11));
      Bounds3<float>::Bounds3
                (&local_2a0,
                 (Point3<float> *)
                 ((long)&cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.x + lVar11),
                 (Point3<float> *)
                 ((long)&cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.x + lVar11));
      Union<float>(&curveBounds,&rayBounds,&local_2a0);
      Expand<float,float>(&rayBounds,(pbrt *)&curveBounds,b,auVar13._0_4_ * 0.5);
      local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
      local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
      local_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
      curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
           rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
           rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
      curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
           rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      fVar16 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar13 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar13,auVar13);
      local_328.x = 0.0;
      local_328.y = 0.0;
      auVar12 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar13 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
      auVar13 = vsqrtss_avx(auVar13,auVar13);
      local_328.z = auVar13._0_4_ * tMax;
      Bounds3<float>::Bounds3(&rayBounds,&local_2a0.pMin,(Point3<float> *)&local_328);
      bVar8 = Overlaps<float>(&rayBounds,&curveBounds);
      if (bVar8) {
        cp_02.n = 4;
        cp_02.ptr = p1;
        bVar8 = RecursiveIntersect(local_2d0,ray,tMax,cp_02,local_2f0,(Float)local_308._0_4_,fVar35,
                                   local_318._0_4_,si);
        if ((si == (optional<pbrt::ShapeIntersection> *)0x0) && (bVar8)) {
          return true;
        }
      }
      local_308._4_4_ = 0;
      local_308._8_4_ = 0;
      local_308._12_4_ = 0;
      local_308._0_4_ = fVar35;
    }
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            Float sin0 =
                std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
            Float sin1 = std::sin(u * common->normalAngle) * common->invSinNormalAngle;
            nHit = sin0 * common->n[0] + sin1 * common->n[1];
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}